

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<bool>::Resize
          (KeyMapBase<bool> *this,map_index_t new_num_buckets)

{
  uint n;
  uint uVar1;
  Arena *this_00;
  KeyNode *node;
  string *psVar2;
  map_index_t b;
  TableEntryPtr *pTVar3;
  MixingHashState MVar4;
  TableEntryPtr *pTVar5;
  string *node_00;
  KeyMapBase<bool> *this_01;
  ulong uVar6;
  uint64_t s;
  unsigned_long local_48 [2];
  KeyMapBase<bool> *local_38;
  
  this_01 = (KeyMapBase<bool> *)local_48;
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = 2;
    (this->super_UntypedMapBase).num_buckets_ = 2;
    this_00 = (this->super_UntypedMapBase).alloc_.arena_;
    if (this_00 == (Arena *)0x0) {
      pTVar3 = (TableEntryPtr *)operator_new(0x10);
    }
    else {
      pTVar3 = (TableEntryPtr *)Arena::AllocateForArray(this_00,0x10);
    }
    *pTVar3 = 0;
    pTVar3[1] = 0;
    (this->super_UntypedMapBase).table_ = pTVar3;
    local_48[0] = rdtsc();
    local_38 = this;
    MVar4 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       local_48,&(this->super_UntypedMapBase).table_,&local_38);
    (this->super_UntypedMapBase).seed_ = (map_index_t)MVar4.state_;
    return;
  }
  if (new_num_buckets < 2) {
    node_00 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((ulong)new_num_buckets,2,"new_num_buckets >= kMinTableSize");
  }
  else {
    node_00 = (string *)0x0;
  }
  if (node_00 != (string *)0x0) {
    Resize();
    do {
      psVar2 = *(string **)node_00;
      b = BucketNumber(this_01,(ViewType)((byte)node_00[8] & 1));
      InsertUnique(this_01,b,(KeyNode *)node_00);
      node_00 = psVar2;
    } while (psVar2 != (string *)0x0);
    return;
  }
  pTVar3 = (this->super_UntypedMapBase).table_;
  n = (this->super_UntypedMapBase).num_buckets_;
  (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
  pTVar5 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
  (this->super_UntypedMapBase).table_ = pTVar5;
  uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
  uVar6 = (ulong)uVar1;
  (this->super_UntypedMapBase).index_of_first_non_null_ = (this->super_UntypedMapBase).num_buckets_;
  if (uVar1 < n) {
    do {
      node = (KeyNode *)pTVar3[uVar6];
      if (((ulong)node & 1) == 0 && node != (KeyNode *)0x0) {
        TransferList(this,node);
      }
      else if (((ulong)node & 1) != 0) {
        UntypedMapBase::TransferTree
                  (&this->super_UntypedMapBase,(Tree *)((long)&node[-1].super_NodeBase.next + 7),
                   NodeToVariantKey);
      }
      uVar6 = uVar6 + 1;
    } while (n != uVar6);
  }
  UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,pTVar3,n);
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = kMinTableSize;
      table_ = CreateEmptyTable(num_buckets_);
      seed_ = Seed();
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      if (internal::TableEntryIsNonEmptyList(old_table[i])) {
        TransferList(static_cast<KeyNode*>(TableEntryToNode(old_table[i])));
      } else if (internal::TableEntryIsTree(old_table[i])) {
        this->TransferTree(TableEntryToTree(old_table[i]), NodeToVariantKey);
      }
    }
    DeleteTable(old_table, old_table_size);
  }